

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_budget(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_budget *peVar1;
  char *pcVar2;
  uint local_34;
  uint local_2c;
  uint8_t ram_cfg;
  int i;
  envy_bios_power_budget *budget;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).budget;
  if (strap == 0) {
    local_34 = 0xff;
  }
  else {
    local_34 = (strap & 0x1c) >> 2;
  }
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).budget.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse BUDGET table at 0x%x, version %x\n",(ulong)peVar1->offset
              ,(ulong)(bios->power).budget.version);
    }
    else {
      fprintf((FILE *)out,"POWER BUDGET table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).budget.version);
      if (((bios->power).budget.version | 0x10) == 0x30) {
        fprintf((FILE *)out,"nvidia-smi cap entry: %i\n",(ulong)(bios->power).budget.cap_entry);
      }
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).budget.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (local_2c = 0; (int)local_2c < (int)(uint)(bios->power).budget.entriesnum;
          local_2c = local_2c + 1) {
        pcVar2 = " ";
        if (local_34 == local_2c) {
          pcVar2 = "*";
        }
        fprintf((FILE *)out,"%s %i: min = %u mW, avg = %u mW, peak = %u mW (unkn12 = %u)\n",pcVar2,
                (ulong)local_2c,(ulong)(bios->power).budget.entries[(int)local_2c].min,
                (ulong)(bios->power).budget.entries[(int)local_2c].avg,
                (bios->power).budget.entries[(int)local_2c].peak,
                (bios->power).budget.entries[(int)local_2c].unkn12);
        envy_bios_dump_hex(bios,out,(bios->power).budget.entries[(int)local_2c].offset,
                           (uint)(bios->power).budget.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_budget(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_budget *budget = &bios->power.budget;
	int i;

	extern uint32_t strap;
	uint8_t ram_cfg = strap?(strap & 0x1c) >> 2:0xff;


	if (!budget->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!budget->valid) {
		fprintf(out, "Failed to parse BUDGET table at 0x%x, version %x\n", budget->offset, budget->version);
		return;
	}

	fprintf(out, "POWER BUDGET table at 0x%x, version %x\n", budget->offset, budget->version);
	switch(budget->version) {
	case 0x20:
	case 0x30:
		fprintf(out, "nvidia-smi cap entry: %i\n", budget->cap_entry);
		break;
	}
	envy_bios_dump_hex(bios, out, budget->offset, budget->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < budget->entriesnum; i++) {
		fprintf(out, "%s %i: min = %u mW, avg = %u mW, peak = %u mW (unkn12 = %u)\n",
			ram_cfg == i?"*":" ", i, budget->entries[i].min,
			budget->entries[i].avg, budget->entries[i].peak,
			budget->entries[i].unkn12
       		);

		envy_bios_dump_hex(bios, out, budget->entries[i].offset, budget->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}